

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DependencyInfoParser.cpp
# Opt level: O3

void __thiscall llbuild::core::DependencyInfoParser::parse(DependencyInfoParser *this)

{
  byte *pbVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  long lVar2;
  _func_int **pp_Var3;
  byte bVar4;
  byte *pbVar5;
  long lVar6;
  size_t sVar7;
  byte *pbVar8;
  char *pcVar9;
  ParseActions *pPVar10;
  byte *pbVar11;
  bool bVar12;
  
  sVar7 = (this->data).Length;
  if ((sVar7 == 0) || (pbVar5 = (byte *)(this->data).Data, pbVar5[sVar7 - 1] != 0)) {
    pPVar10 = this->actions;
    UNRECOVERED_JUMPTABLE = pPVar10->_vptr_ParseActions[2];
    pcVar9 = "missing null terminator";
  }
  else if (*pbVar5 == 0) {
    pbVar8 = pbVar5 + sVar7;
    bVar4 = 0;
    while( true ) {
      pbVar1 = pbVar5 + 1;
      lVar2 = 0;
      pbVar11 = pbVar5 + 2;
      while (pbVar11[-1] != 0) {
        lVar2 = lVar2 + -1;
        bVar12 = pbVar8 <= pbVar11;
        pbVar11 = pbVar11 + 1;
        if (bVar12) {
          __assert_fail("cur < end",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/DependencyInfoParser.cpp"
                        ,0x4f,"void llbuild::core::DependencyInfoParser::parse()");
        }
      }
      if (pbVar8 <= pbVar11 + -1) {
        __assert_fail("*operandEnd == \'\\x00\' && cur < end",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/DependencyInfoParser.cpp"
                      ,0x52,"void llbuild::core::DependencyInfoParser::parse()");
      }
      if (lVar2 == 0) break;
      lVar2 = -lVar2;
      if (bVar4 < 0x11) {
        if (bVar4 == 0) {
          pPVar10 = this->actions;
          lVar6 = (long)pbVar5 - (long)(this->data).Data;
          if (lVar6 != 0) {
            pp_Var3 = pPVar10->_vptr_ParseActions;
            pcVar9 = "invalid duplicate version";
            goto LAB_001d1eee;
          }
          (*pPVar10->_vptr_ParseActions[3])(pPVar10,pbVar1,lVar2);
        }
        else if (bVar4 == 0x10) {
          (*this->actions->_vptr_ParseActions[4])(this->actions,pbVar1,lVar2);
        }
        else {
LAB_001d1ed0:
          pPVar10 = this->actions;
          lVar6 = (long)pbVar5 - (long)(this->data).Data;
          pp_Var3 = pPVar10->_vptr_ParseActions;
          pcVar9 = "unknown opcode in file";
LAB_001d1eee:
          (*pp_Var3[2])(pPVar10,pcVar9,lVar6);
        }
      }
      else if (bVar4 == 0x11) {
        (*this->actions->_vptr_ParseActions[6])(this->actions,pbVar1,lVar2);
      }
      else {
        if (bVar4 != 0x40) goto LAB_001d1ed0;
        (*this->actions->_vptr_ParseActions[5])(this->actions,pbVar1,lVar2);
      }
      if (pbVar11 == pbVar8) {
        return;
      }
      bVar4 = *pbVar11;
      pbVar5 = pbVar11;
    }
    pPVar10 = this->actions;
    sVar7 = (long)pbVar5 - (long)(this->data).Data;
    UNRECOVERED_JUMPTABLE = pPVar10->_vptr_ParseActions[2];
    pcVar9 = "empty operand";
  }
  else {
    pPVar10 = this->actions;
    UNRECOVERED_JUMPTABLE = pPVar10->_vptr_ParseActions[2];
    pcVar9 = "missing version record";
    sVar7 = 0;
  }
  (*UNRECOVERED_JUMPTABLE)(pPVar10,pcVar9,sVar7);
  return;
}

Assistant:

void DependencyInfoParser::parse() {
  // Validate that the file ends with a null byte, if not it is malformed and we
  // just bail on parsing.
  if (!data.endswith(StringRef("\0", 1))) {
    actions.error("missing null terminator", data.size());
    return;
  }

  // Validate that the file starts with the version record.
  if (Opcode(data[0]) != Opcode::Version) {
    actions.error("missing version record", 0);
    return;
  }

  // Parse the records in turn.
  const char* cur = data.begin();
  const char* end = data.end();
  while (cur != end) {
    const char* opcodeStart = cur;
    auto opcode = Opcode(*cur++);
    const char* operandStart = cur;
    while (*cur != '\0') {
      ++cur;
      // We require the file have a terminating null, so we can never scan past
      // the end.
      assert (cur < end);
    }
    const char* operandEnd = cur;
    assert(*operandEnd == '\x00' && cur < end);
    ++cur;

    // Diagnose empty operands (missing isn't possible.
    auto operand = StringRef(operandStart, operandEnd - operandStart);
    if (operand.empty()) {
      actions.error("empty operand", opcodeStart - data.data());
      break;
    }

    // Handle the opcode.
    switch (opcode) {
    case Opcode::Version: {
      // Diagnose duplicate version records.
      if (opcodeStart != data.begin()) {
        actions.error("invalid duplicate version", opcodeStart - data.data());
        break;
      }
      actions.actOnVersion(operand);
      break;
    }

    case Opcode::Input: {
      actions.actOnInput(operand);
      break;
    }

    case Opcode::Missing: {
      actions.actOnMissing(operand);
      break;
    }

    case Opcode::Output: {
      actions.actOnOutput(operand);
      break;
    }

    default:
      actions.error("unknown opcode in file", opcodeStart - data.data());
      break;
    }
  }
}